

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser-test.c++
# Opt level: O1

void __thiscall capnp::anon_unknown_0::TestCase148::run(TestCase148 *this)

{
  int16_t iVar1;
  ReaderFor<unsigned_int> RVar2;
  int iVar3;
  ConstSchema CVar4;
  bool bVar5;
  float fVar6;
  ReaderFor<Text> RVar7;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr displayName;
  StringPtr nestedName;
  StringPtr nestedName_00;
  StringPtr nestedName_01;
  StringPtr nestedName_02;
  StringPtr nestedName_03;
  StringPtr content;
  StringPtr diskPath;
  Fault f;
  ParsedSchema fileSchema;
  ReaderFor<capnp::DynamicStruct> structConst;
  ReaderFor<capnp::DynamicStruct> genericConst;
  SchemaParser parser;
  ReaderFor<capnp::DynamicList> list;
  FakeFileReader reader;
  ParsedSchema local_198;
  ParsedSchema local_150;
  ReaderFor<capnp::DynamicStruct> local_140;
  ArrayPtr<const_char> local_108;
  ReaderFor<capnp::DynamicStruct> local_f8;
  SchemaParser local_c0;
  ReaderFor<capnp::DynamicList> local_a8;
  undefined8 local_68;
  undefined8 uStack_60;
  FakeFileReader local_58;
  
  FakeFileReader::FakeFileReader(&local_58);
  SchemaParser::SchemaParser(&local_c0);
  SchemaParser::setDiskFilesystem(&local_c0,&local_58.super_Filesystem);
  name_05.content.size_ = 0xc;
  name_05.content.ptr = "const.capnp";
  content.content.size_ = 0x131;
  content.content.ptr =
       "@0x8123456789abcdef;\nconst uint32Const :UInt32 = 1234;\nconst listConst :List(Float32) = [1.25, 2.5, 3e4];\nconst structConst :Foo = (bar = 123, baz = \"qux\");\nstruct Foo {\n  bar @0 :Int16;\n  baz @1 :Text;\n}\nconst genericConst :TestGeneric(Text) = (value = \"text\");\nstruct TestGeneric(T) {\n  value @0 :T;\n}\n"
  ;
  FakeFileReader::add(&local_58,name_05,content);
  local_68 = 0;
  uStack_60 = 0;
  displayName.content.size_ = 0xc;
  displayName.content.ptr = "const.capnp";
  diskPath.content.size_ = 0xc;
  diskPath.content.ptr = "const.capnp";
  local_150 = SchemaParser::parseDiskFile
                        (&local_c0,displayName,diskPath,(ArrayPtr<const_kj::StringPtr>)ZEXT816(0));
  nestedName.content.size_ = 0xc;
  nestedName.content.ptr = "uint32Const";
  local_198 = ParsedSchema::getNested(&local_150,nestedName);
  local_a8.schema.elementType._0_8_ = Schema::asConst(&local_198.super_Schema);
  RVar2 = ConstSchema::as<unsigned_int>((ConstSchema *)&local_a8);
  if ((RVar2 != 0x4d2) && (kj::_::Debug::minSeverity < 3)) {
    local_140.schema.super_Schema.raw._0_4_ = 0x4d2;
    nestedName_00.content.size_ = 0xc;
    nestedName_00.content.ptr = "uint32Const";
    local_198 = ParsedSchema::getNested(&local_150,nestedName_00);
    local_a8.schema.elementType._0_8_ = Schema::asConst(&local_198.super_Schema);
    local_f8.schema.super_Schema.raw._0_4_ =
         (float)ConstSchema::as<unsigned_int>((ConstSchema *)&local_a8);
    kj::_::Debug::log<char_const(&)[90],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0xae,ERROR,
               "\"failed: expected \" \"(1234) == (fileSchema.getNested(\\\"uint32Const\\\").asConst().as<uint32_t>())\", 1234, fileSchema.getNested(\"uint32Const\").asConst().as<uint32_t>()"
               ,(char (*) [90])
                "failed: expected (1234) == (fileSchema.getNested(\"uint32Const\").asConst().as<uint32_t>())"
               ,(int *)&local_140,(uint *)&local_f8);
  }
  nestedName_01.content.size_ = 10;
  nestedName_01.content.ptr = "listConst";
  local_198 = ParsedSchema::getNested(&local_150,nestedName_01);
  local_140.schema.super_Schema.raw = (Schema)Schema::asConst(&local_198.super_Schema);
  ConstSchema::as<capnp::DynamicList>(&local_a8,(ConstSchema *)&local_140);
  if (local_a8.reader.elementCount == 3) {
    DynamicList::Reader::operator[]((Reader *)&local_198,&local_a8,0);
    fVar6 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&local_198);
    DynamicValue::Reader::~Reader((Reader *)&local_198);
    if (((fVar6 != 1.25) || (NAN(fVar6))) && (kj::_::Debug::minSeverity < 3)) {
      local_140.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x3ff4000000000000;
      DynamicList::Reader::operator[]((Reader *)&local_198,&local_a8,0);
      fVar6 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&local_198);
      local_f8.schema.super_Schema.raw._0_4_ = fVar6;
      kj::_::Debug::log<char_const(&)[49],double,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0xb2,ERROR,
                 "\"failed: expected \" \"(1.25) == (list[0].as<float>())\", 1.25, list[0].as<float>()"
                 ,(char (*) [49])"failed: expected (1.25) == (list[0].as<float>())",
                 (double *)&local_140,(float *)&local_f8);
      DynamicValue::Reader::~Reader((Reader *)&local_198);
    }
    DynamicList::Reader::operator[]((Reader *)&local_198,&local_a8,1);
    fVar6 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&local_198);
    DynamicValue::Reader::~Reader((Reader *)&local_198);
    if (((fVar6 != 2.5) || (NAN(fVar6))) && (kj::_::Debug::minSeverity < 3)) {
      local_140.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x4004000000000000;
      DynamicList::Reader::operator[]((Reader *)&local_198,&local_a8,1);
      fVar6 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&local_198);
      local_f8.schema.super_Schema.raw._0_4_ = fVar6;
      kj::_::Debug::log<char_const(&)[48],double,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0xb3,ERROR,
                 "\"failed: expected \" \"(2.5) == (list[1].as<float>())\", 2.5, list[1].as<float>()"
                 ,(char (*) [48])"failed: expected (2.5) == (list[1].as<float>())",
                 (double *)&local_140,(float *)&local_f8);
      DynamicValue::Reader::~Reader((Reader *)&local_198);
    }
    DynamicList::Reader::operator[]((Reader *)&local_198,&local_a8,2);
    fVar6 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&local_198);
    DynamicValue::Reader::~Reader((Reader *)&local_198);
    if (((fVar6 != 30000.0) || (NAN(fVar6))) && (kj::_::Debug::minSeverity < 3)) {
      local_140.schema.super_Schema.raw._0_4_ = 0x46ea6000;
      DynamicList::Reader::operator[]((Reader *)&local_198,&local_a8,2);
      fVar6 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&local_198);
      local_f8.schema.super_Schema.raw._0_4_ = fVar6;
      kj::_::Debug::log<char_const(&)[49],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0xb4,ERROR,
                 "\"failed: expected \" \"(3e4f) == (list[2].as<float>())\", 3e4f, list[2].as<float>()"
                 ,(char (*) [49])"failed: expected (3e4f) == (list[2].as<float>())",
                 (float *)&local_140,(float *)&local_f8);
      DynamicValue::Reader::~Reader((Reader *)&local_198);
    }
    nestedName_02.content.size_ = 0xc;
    nestedName_02.content.ptr = "structConst";
    local_198 = ParsedSchema::getNested(&local_150,nestedName_02);
    CVar4 = Schema::asConst(&local_198.super_Schema);
    local_f8.schema.super_Schema.raw = CVar4.super_Schema.raw;
    ConstSchema::as<capnp::DynamicStruct>(&local_140,(ConstSchema *)&local_f8);
    name.content.size_ = 4;
    name.content.ptr = "bar";
    DynamicStruct::Reader::get((Reader *)&local_198,&local_140,name);
    iVar1 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply((Reader *)&local_198);
    DynamicValue::Reader::~Reader((Reader *)&local_198);
    if ((iVar1 != 0x7b) && (kj::_::Debug::minSeverity < 3)) {
      local_f8.schema.super_Schema.raw._0_4_ = 1.7236e-43;
      name_00.content.size_ = 4;
      name_00.content.ptr = "bar";
      DynamicStruct::Reader::get((Reader *)&local_198,&local_140,name_00);
      local_108.ptr._0_2_ =
           DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply((Reader *)&local_198);
      kj::_::Debug::log<char_const(&)[65],int,short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0xb7,ERROR,
                 "\"failed: expected \" \"(123) == (structConst.get(\\\"bar\\\").as<int16_t>())\", 123, structConst.get(\"bar\").as<int16_t>()"
                 ,(char (*) [65])
                  "failed: expected (123) == (structConst.get(\"bar\").as<int16_t>())",
                 (int *)&local_f8,(short *)&local_108);
      DynamicValue::Reader::~Reader((Reader *)&local_198);
    }
    name_01.content.size_ = 4;
    name_01.content.ptr = "baz";
    DynamicStruct::Reader::get((Reader *)&local_198,&local_140,name_01);
    RVar7 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&local_198);
    bVar5 = true;
    if (RVar7.super_StringPtr.content.size_ == 4) {
      iVar3 = bcmp(RVar7.super_StringPtr.content.ptr,"qux",3);
      bVar5 = iVar3 != 0;
    }
    DynamicValue::Reader::~Reader((Reader *)&local_198);
    if ((bool)(bVar5 & kj::_::Debug::minSeverity < 3)) {
      name_02.content.size_ = 4;
      name_02.content.ptr = "baz";
      DynamicStruct::Reader::get((Reader *)&local_198,&local_140,name_02);
      local_f8._0_16_ =
           DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&local_198);
      kj::_::Debug::log<char_const(&)[64],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0xb8,ERROR,
                 "\"failed: expected \" \"(\\\"qux\\\") == (structConst.get(\\\"baz\\\").as<Text>())\", \"qux\", structConst.get(\"baz\").as<Text>()"
                 ,(char (*) [64])
                  "failed: expected (\"qux\") == (structConst.get(\"baz\").as<Text>())",
                 (char (*) [4])0x502135,(Reader *)&local_f8);
      DynamicValue::Reader::~Reader((Reader *)&local_198);
    }
    nestedName_03.content.size_ = 0xd;
    nestedName_03.content.ptr = "genericConst";
    local_198 = ParsedSchema::getNested(&local_150,nestedName_03);
    CVar4 = Schema::asConst(&local_198.super_Schema);
    local_108.ptr = (char *)CVar4.super_Schema.raw;
    ConstSchema::as<capnp::DynamicStruct>(&local_f8,(ConstSchema *)&local_108);
    name_03.content.size_ = 6;
    name_03.content.ptr = "value";
    DynamicStruct::Reader::get((Reader *)&local_198,&local_f8,name_03);
    RVar7 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&local_198);
    bVar5 = true;
    if (RVar7.super_StringPtr.content.size_ == 5) {
      iVar3 = bcmp(RVar7.super_StringPtr.content.ptr,"text",4);
      bVar5 = iVar3 != 0;
    }
    DynamicValue::Reader::~Reader((Reader *)&local_198);
    if ((bool)(bVar5 & kj::_::Debug::minSeverity < 3)) {
      name_04.content.size_ = 6;
      name_04.content.ptr = "value";
      DynamicStruct::Reader::get((Reader *)&local_198,&local_f8,name_04);
      local_108 = (ArrayPtr<const_char>)
                  DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                            ((Reader *)&local_198);
      kj::_::Debug::log<char_const(&)[68],char_const(&)[5],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0xbb,ERROR,
                 "\"failed: expected \" \"(\\\"text\\\") == (genericConst.get(\\\"value\\\").as<Text>())\", \"text\", genericConst.get(\"value\").as<Text>()"
                 ,(char (*) [68])
                  "failed: expected (\"text\") == (genericConst.get(\"value\").as<Text>())",
                 (char (*) [5])0x4f41ac,(Reader *)&local_108);
      DynamicValue::Reader::~Reader((Reader *)&local_198);
    }
    SchemaParser::~SchemaParser(&local_c0);
    FakeFileReader::~FakeFileReader(&local_58);
    return;
  }
  local_140.schema.super_Schema.raw._0_4_ = 3;
  local_f8.schema.super_Schema.raw._0_4_ = (float)local_a8.reader.elementCount;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
            ((Fault *)&local_198,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
             ,0xb1,FAILED,"(3u) == (list.size())","3u, list.size()",(uint *)&local_140,
             (uint *)&local_f8);
  kj::_::Debug::Fault::fatal((Fault *)&local_198);
}

Assistant:

TEST(SchemaParser, Constants) {
  // This is actually a test of the full dynamic API stack for constants, because the schemas for
  // constants are not actually accessible from the generated code API, so the only way to ever
  // get a ConstSchema is by parsing it.

  FakeFileReader reader;
  SchemaParser parser;
  parser.setDiskFilesystem(reader);

  reader.add("const.capnp",
      "@0x8123456789abcdef;\n"
      "const uint32Const :UInt32 = 1234;\n"
      "const listConst :List(Float32) = [1.25, 2.5, 3e4];\n"
      "const structConst :Foo = (bar = 123, baz = \"qux\");\n"
      "struct Foo {\n"
      "  bar @0 :Int16;\n"
      "  baz @1 :Text;\n"
      "}\n"
      "const genericConst :TestGeneric(Text) = (value = \"text\");\n"
      "struct TestGeneric(T) {\n"
      "  value @0 :T;\n"
      "}\n");

  ParsedSchema fileSchema = parser.parseDiskFile(
      "const.capnp", "const.capnp", nullptr);

  EXPECT_EQ(1234, fileSchema.getNested("uint32Const").asConst().as<uint32_t>());

  auto list = fileSchema.getNested("listConst").asConst().as<DynamicList>();
  ASSERT_EQ(3u, list.size());
  EXPECT_EQ(1.25, list[0].as<float>());
  EXPECT_EQ(2.5, list[1].as<float>());
  EXPECT_EQ(3e4f, list[2].as<float>());

  auto structConst = fileSchema.getNested("structConst").asConst().as<DynamicStruct>();
  EXPECT_EQ(123, structConst.get("bar").as<int16_t>());
  EXPECT_EQ("qux", structConst.get("baz").as<Text>());

  auto genericConst = fileSchema.getNested("genericConst").asConst().as<DynamicStruct>();
  EXPECT_EQ("text", genericConst.get("value").as<Text>());
}